

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetDispositionContext
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,
          MESSAGE_DISPOSITION_CONTEXT_HANDLE dispositionContext,
          MESSAGE_DISPOSITION_CONTEXT_DESTROY_FUNCTION dispositionContextDestroyFunction)

{
  LOGGER_LOG p_Var1;
  IOTHUB_MESSAGE_RESULT IVar2;
  
  if ((dispositionContext == (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0 ||
      iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) ||
      dispositionContextDestroyFunction == (MESSAGE_DISPOSITION_CONTEXT_DESTROY_FUNCTION)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      IVar2 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      IVar2 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetDispositionContext",0x4ba,1,
                "Invalid argument (iotHubMessageHandle=%p, dispositionContext=%p, dispositionContextDestroyFunction=%p)"
                ,iotHubMessageHandle,dispositionContext,dispositionContextDestroyFunction);
    }
  }
  else {
    iotHubMessageHandle->dispositionContext = dispositionContext;
    iotHubMessageHandle->dispositionContextDestroyFunction = dispositionContextDestroyFunction;
    IVar2 = IOTHUB_MESSAGE_OK;
  }
  return IVar2;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetDispositionContext(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, MESSAGE_DISPOSITION_CONTEXT_HANDLE dispositionContext, MESSAGE_DISPOSITION_CONTEXT_DESTROY_FUNCTION dispositionContextDestroyFunction)
{
    IOTHUB_MESSAGE_RESULT result;

    if (iotHubMessageHandle == NULL || dispositionContext == NULL || dispositionContextDestroyFunction == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, dispositionContext=%p, dispositionContextDestroyFunction=%p)",
            iotHubMessageHandle, dispositionContext, dispositionContextDestroyFunction);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        iotHubMessageHandle->dispositionContext = dispositionContext;
        iotHubMessageHandle->dispositionContextDestroyFunction = dispositionContextDestroyFunction;
        result = IOTHUB_MESSAGE_OK;
    }

    return result;
}